

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.h
# Opt level: O2

void __thiscall
bloaty::dwarf::CompilationUnitSizes::SetAddressSize(CompilationUnitSizes *this,uint8_t address_size)

{
  int iVar1;
  undefined7 in_register_00000031;
  Arg *in_R8;
  string_view format;
  string local_60;
  Arg local_40;
  
  iVar1 = (int)CONCAT71(in_register_00000031,address_size);
  if ((iVar1 != 4) && (iVar1 != 8)) {
    absl::substitute_internal::Arg::Arg(&local_40,(uint)address_size);
    format._M_str = (char *)&local_40;
    format._M_len = (size_t)"Unexpected address size: $0";
    absl::Substitute_abi_cxx11_(&local_60,(absl *)0x1b,format,in_R8);
    Throw(local_60._M_dataplus._M_p,0x70);
  }
  this->addr8_ = address_size == '\b';
  return;
}

Assistant:

void SetAddressSize(uint8_t address_size) {
    if (address_size != 4 && address_size != 8) {
      THROWF("Unexpected address size: $0", address_size);
    }
    addr8_ = address_size == 8;
  }